

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

void __thiscall miniscript::Node<XOnlyPubKey>::~Node(Node<XOnlyPubKey> *this)

{
  long lVar1;
  bool bVar2;
  vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *in_RDI;
  long in_FS_OFFSET;
  type node;
  __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar2 = std::
            vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
            ::empty((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                     *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::back((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
            *)in_stack_ffffffffffffffc8);
    std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>::shared_ptr
              ((shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)in_stack_ffffffffffffffc8,
               (shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)0x2dd2b9);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::pop_back((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                *)in_stack_ffffffffffffffc8);
    while( true ) {
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(in_stack_ffffffffffffffc8);
      bVar2 = std::
              vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              ::empty((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                       *)in_RDI);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(in_stack_ffffffffffffffc8);
      std::
      vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ::back((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
              *)in_stack_ffffffffffffffc8);
      std::
      vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ::push_back((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                   *)in_stack_ffffffffffffffc8,(value_type *)0x2dd316);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(in_stack_ffffffffffffffc8);
      std::
      vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ::pop_back((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffffc8);
    }
    std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *)in_stack_ffffffffffffffc8);
  }
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::~vector((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             *)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::~vector(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Node() {
        while (!subs.empty()) {
            auto node = std::move(subs.back());
            subs.pop_back();
            while (!node->subs.empty()) {
                subs.push_back(std::move(node->subs.back()));
                node->subs.pop_back();
            }
        }
    }